

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> * __thiscall
vkb::Swapchain::get_images
          (Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *__return_storage_ptr__,
          Swapchain *this)

{
  Error error;
  error_code local_60;
  VkResult local_50;
  undefined4 uStack_4c;
  VkResult local_34;
  undefined1 local_30 [4];
  VkResult swapchain_images_ret;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> swapchain_images;
  Swapchain *this_local;
  
  swapchain_images.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_30);
  local_34 = detail::
             get_vector<VkImage_T*,VkResult(*&)(VkDevice_T*,VkSwapchainKHR_T*,unsigned_int*,VkImage_T**),VkDevice_T*&,VkSwapchainKHR_T*&>
                       ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_30,
                        (_func_VkResult_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_uint_ptr_VkImage_T_ptr_ptr
                         **)&this->internal_table,&this->device,&this->swapchain);
  if (local_34 == VK_SUCCESS) {
    Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::Result
              (__return_storage_ptr__,(vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_30)
    ;
  }
  else {
    std::error_code::error_code<vkb::SwapchainError,void>(&local_60,failed_get_swapchain_images);
    local_50 = local_34;
    error._20_4_ = uStack_4c;
    error.vk_result = local_34;
    error.type._M_cat = local_60._M_cat;
    error.type._M_value = local_60._M_value;
    error.type._4_4_ = local_60._4_4_;
    Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::Result
              (__return_storage_ptr__,error);
  }
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<VkImage>> Swapchain::get_images() {
    std::vector<VkImage> swapchain_images;

    auto swapchain_images_ret =
        detail::get_vector<VkImage>(swapchain_images, internal_table.fp_vkGetSwapchainImagesKHR, device, swapchain);
    if (swapchain_images_ret != VK_SUCCESS) {
        return Error{ SwapchainError::failed_get_swapchain_images, swapchain_images_ret };
    }
    return swapchain_images;
}